

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall
cmMakefile::ExecuteCommand(cmMakefile *this,cmListFileFunction *lff,cmExecutionStatus *status)

{
  pointer ppcVar1;
  pointer ppcVar2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  size_t sVar6;
  long *plVar7;
  ostream *poVar8;
  cmCommand *pcVar9;
  undefined4 extraout_var;
  size_type *psVar10;
  cmCommand *pcVar11;
  bool bVar12;
  __normal_iterator<cmFunctionBlocker_*const_*,_std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>_>
  __tmp;
  pointer ppcVar13;
  pointer pcVar14;
  int d;
  cmMakefileCall stack_manager;
  istringstream s;
  string local_1f8;
  cmMakefileCall local_1d8;
  long *local_1d0 [2];
  long local_1c0 [2];
  undefined1 local_1b0 [16];
  cmCommand local_1a0 [2];
  ios_base local_140 [8];
  ios_base local_138 [264];
  
  ppcVar2 = (this->FunctionBlockers).
            super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar13 = (this->FunctionBlockers).
             super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppcVar2 != ppcVar13) {
    while (ppcVar13 != ppcVar2) {
      ppcVar1 = ppcVar13 + -1;
      ppcVar13 = ppcVar13 + -1;
      iVar4 = (**(*ppcVar1)->_vptr_cmFunctionBlocker)(*ppcVar1,lff,this,status);
      if ((char)iVar4 != '\0') {
        return true;
      }
    }
  }
  cmMakefileCall::cmMakefileCall(&local_1d8,this,&lff->super_cmCommandContext,status);
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,"CMAKE_MAXIMUM_RECURSION_DEPTH","");
  psVar5 = GetDef(this,(string *)local_1b0);
  if (psVar5 == (string *)0x0) {
    pcVar14 = (char *)0x0;
  }
  else {
    pcVar14 = (psVar5->_M_dataplus)._M_p;
  }
  if ((cmCommand *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,(long)local_1a0[0]._vptr_cmCommand + 1);
  }
  if (pcVar14 == (char *)0x0) {
    iVar4 = 1000;
  }
  else {
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    sVar6 = strlen(pcVar14);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,pcVar14,pcVar14 + sVar6);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1b0,(string *)&local_1f8,_S_in);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    plVar7 = (long *)std::istream::operator>>((istream *)local_1b0,(int *)&local_1f8);
    iVar4 = 1000;
    if ((*(byte *)((long)plVar7 + *(long *)(*plVar7 + -0x18) + 0x20) & 5) == 0) {
      iVar4 = (int)local_1f8._M_dataplus._M_p;
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
    std::ios_base::~ios_base(local_138);
  }
  if (iVar4 < this->RecursionDepth) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b0,"Maximum recursion depth of ",0x1b);
    poVar8 = (ostream *)std::ostream::operator<<(local_1b0,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," exceeded",9);
    std::__cxx11::stringbuf::str();
    IssueMessage(this,FATAL_ERROR,&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    cmSystemTools::s_FatalErrorOccured = true;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
    std::ios_base::~ios_base(local_140);
  }
  else {
    pcVar9 = cmState::GetCommandByExactName
                       (this->GlobalGenerator->CMakeInstance->State,(string *)lff);
    if (pcVar9 != (cmCommand *)0x0) {
      iVar4 = (*pcVar9->_vptr_cmCommand[6])(pcVar9);
      pcVar9 = (cmCommand *)CONCAT44(extraout_var,iVar4);
      pcVar9->Makefile = this;
      bVar12 = true;
      if ((cmSystemTools::s_FatalErrorOccured == false) &&
         (bVar3 = cmSystemTools::GetInterruptFlag(), !bVar3)) {
        if (this->GlobalGenerator->CMakeInstance->Trace == true) {
          PrintCommandTrace(this,lff);
        }
        iVar4 = (*pcVar9->_vptr_cmCommand[2])(pcVar9,&lff->Arguments,status);
        if ((byte)((byte)iVar4 ^ 1 | status->NestedError) == 1) {
          if (status->NestedError == false) {
            pcVar14 = (lff->super_cmCommandContext).Name.Original._M_dataplus._M_p;
            local_1d0[0] = local_1c0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1d0,pcVar14,
                       pcVar14 + (lff->super_cmCommandContext).Name.Original._M_string_length);
            plVar7 = (long *)std::__cxx11::string::append((char *)local_1d0);
            psVar10 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_1f8.field_2._M_allocated_capacity = *psVar10;
              local_1f8.field_2._8_8_ = plVar7[3];
              local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
            }
            else {
              local_1f8.field_2._M_allocated_capacity = *psVar10;
              local_1f8._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_1f8._M_string_length = plVar7[1];
            *plVar7 = (long)psVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            cmCommand::GetError(pcVar9);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f8);
            pcVar11 = (cmCommand *)(plVar7 + 2);
            if ((cmCommand *)*plVar7 == pcVar11) {
              local_1a0[0]._vptr_cmCommand = pcVar11->_vptr_cmCommand;
              local_1a0[0].Makefile = (cmMakefile *)plVar7[3];
              local_1b0._0_8_ = local_1a0;
            }
            else {
              local_1a0[0]._vptr_cmCommand = pcVar11->_vptr_cmCommand;
              local_1b0._0_8_ = (cmCommand *)*plVar7;
            }
            local_1b0._8_8_ = plVar7[1];
            *plVar7 = (long)pcVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_1d0[0] != local_1c0) {
              operator_delete(local_1d0[0],local_1c0[0] + 1);
            }
            IssueMessage(this,FATAL_ERROR,(string *)local_1b0);
            if ((cmCommand *)local_1b0._0_8_ != local_1a0) {
              operator_delete((void *)local_1b0._0_8_,(long)local_1a0[0]._vptr_cmCommand + 1);
            }
          }
          if (this->GlobalGenerator->CMakeInstance->CurrentWorkingMode != NORMAL_MODE) {
            cmSystemTools::s_FatalErrorOccured = true;
          }
          bVar12 = false;
        }
        else {
          iVar4 = (*pcVar9->_vptr_cmCommand[5])(pcVar9);
          if ((char)iVar4 != '\0') {
            local_1b0._0_8_ = pcVar9;
            std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
                      ((vector<cmCommand*,std::allocator<cmCommand*>> *)&this->FinalPassCommands,
                       (cmCommand **)local_1b0);
            pcVar9 = (cmCommand *)0x0;
          }
        }
      }
      if (pcVar9 != (cmCommand *)0x0) {
        (*pcVar9->_vptr_cmCommand[1])(pcVar9);
      }
      goto LAB_001c22a5;
    }
    bVar12 = true;
    if ((cmSystemTools::s_FatalErrorOccured != false) ||
       (bVar3 = cmSystemTools::GetInterruptFlag(), bVar3)) goto LAB_001c22a5;
    local_1b0._0_8_ = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b0,"Unknown CMake command \"","");
    std::__cxx11::string::_M_append
              (local_1b0,(ulong)(lff->super_cmCommandContext).Name.Original._M_dataplus._M_p);
    std::__cxx11::string::append(local_1b0);
    IssueMessage(this,FATAL_ERROR,(string *)local_1b0);
    cmSystemTools::s_FatalErrorOccured = true;
    if ((cmCommand *)local_1b0._0_8_ != local_1a0) {
      operator_delete((void *)local_1b0._0_8_,(long)local_1a0[0]._vptr_cmCommand + 1);
    }
  }
  bVar12 = false;
LAB_001c22a5:
  cmMakefileCall::~cmMakefileCall(&local_1d8);
  return bVar12;
}

Assistant:

bool cmMakefile::ExecuteCommand(const cmListFileFunction& lff,
                                cmExecutionStatus& status)
{
  bool result = true;

  // quick return if blocked
  if (this->IsFunctionBlocked(lff, status)) {
    // No error.
    return result;
  }

  // Place this call on the call stack.
  cmMakefileCall stack_manager(this, lff, status);
  static_cast<void>(stack_manager);

  // Check for maximum recursion depth.
  int depth = CMake_DEFAULT_RECURSION_LIMIT;
  const char* depthStr = this->GetDefinition("CMAKE_MAXIMUM_RECURSION_DEPTH");
  if (depthStr) {
    std::istringstream s(depthStr);
    int d;
    if (s >> d) {
      depth = d;
    }
  }
  if (this->RecursionDepth > depth) {
    std::ostringstream e;
    e << "Maximum recursion depth of " << depth << " exceeded";
    this->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  // Lookup the command prototype.
  if (cmCommand* proto =
        this->GetState()->GetCommandByExactName(lff.Name.Lower)) {
    // Clone the prototype.
    std::unique_ptr<cmCommand> pcmd(proto->Clone());
    pcmd->SetMakefile(this);

    // Decide whether to invoke the command.
    if (!cmSystemTools::GetFatalErrorOccured()) {
      // if trace is enabled, print out invoke information
      if (this->GetCMakeInstance()->GetTrace()) {
        this->PrintCommandTrace(lff);
      }
      // Try invoking the command.
      bool invokeSucceeded = pcmd->InvokeInitialPass(lff.Arguments, status);
      bool hadNestedError = status.GetNestedError();
      if (!invokeSucceeded || hadNestedError) {
        if (!hadNestedError) {
          // The command invocation requested that we report an error.
          std::string const error =
            std::string(lff.Name.Original) + " " + pcmd->GetError();
          this->IssueMessage(MessageType::FATAL_ERROR, error);
        }
        result = false;
        if (this->GetCMakeInstance()->GetWorkingMode() != cmake::NORMAL_MODE) {
          cmSystemTools::SetFatalErrorOccured();
        }
      } else if (pcmd->HasFinalPass()) {
        // use the command
        this->FinalPassCommands.push_back(pcmd.release());
      }
    }
  } else {
    if (!cmSystemTools::GetFatalErrorOccured()) {
      std::string error = "Unknown CMake command \"";
      error += lff.Name.Original;
      error += "\".";
      this->IssueMessage(MessageType::FATAL_ERROR, error);
      result = false;
      cmSystemTools::SetFatalErrorOccured();
    }
  }

  return result;
}